

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O2

int WriteOutput(Context *context)

{
  uint8_t *__ptr;
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  size_t __n;
  int iVar4;
  char *pcVar5;
  
  __ptr = context->output;
  context->total_out = (size_t)(context->next_out + (context->total_out - (long)__ptr));
  iVar4 = 1;
  __n = (long)context->next_out - (long)__ptr;
  if ((__n != 0) && (context->test_integrity == 0)) {
    fwrite(__ptr,1,__n,(FILE *)context->fout);
    iVar1 = ferror((FILE *)context->fout);
    __stream = _stderr;
    if (iVar1 != 0) {
      pcVar5 = "con";
      if (context->current_output_path != (char *)0x0) {
        pcVar5 = context->current_output_path;
      }
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      iVar4 = 0;
      fprintf(__stream,"failed to write output [%s]: %s\n",pcVar5,pcVar3);
    }
  }
  return iVar4;
}

Assistant:

static BROTLI_BOOL WriteOutput(Context* context) {
  size_t out_size = (size_t)(context->next_out - context->output);
  context->total_out += out_size;
  if (out_size == 0) return BROTLI_TRUE;
  if (context->test_integrity) return BROTLI_TRUE;

  fwrite(context->output, 1, out_size, context->fout);
  if (ferror(context->fout)) {
    fprintf(stderr, "failed to write output [%s]: %s\n",
            PrintablePath(context->current_output_path), strerror(errno));
    return BROTLI_FALSE;
  }
  return BROTLI_TRUE;
}